

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_12ce2fb::HandleSourceMode
               (cmExecutionStatus *status,string *name,OutType infoType,string *variable,
               string *propertyName,cmMakefile *directory_makefile,
               bool source_file_paths_should_be_absolute)

{
  cmMakefile *makefile;
  cmSourceFile *this;
  cmValue value;
  bool bVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string source_file_absolute_path;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  size_type local_80;
  pointer local_78;
  string local_70;
  string local_50;
  
  if (name->_M_string_length == 0) {
    local_90._M_len = (size_t)&local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"not given name for SOURCE scope.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((size_type *)local_90._M_len != &local_80) {
      operator_delete((void *)local_90._M_len,local_80 + 1);
    }
    bVar1 = false;
  }
  else {
    SetPropertyCommand::MakeSourceFilePathAbsoluteIfNeeded
              (&local_70,status,name,source_file_paths_should_be_absolute);
    this = cmMakefile::GetOrCreateSource(directory_makefile,&local_70,false,Ambiguous);
    bVar1 = this != (cmSourceFile *)0x0;
    if (this == (cmSourceFile *)0x0) {
      local_90._M_len = 0x36;
      local_90._M_str = "given SOURCE name that could not be found or created: ";
      local_80 = local_70._M_string_length;
      local_78 = local_70._M_dataplus._M_p;
      views._M_len = 2;
      views._M_array = &local_90;
      cmCatViews_abi_cxx11_(&local_50,views);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      makefile = status->Makefile;
      value = cmSourceFile::GetPropertyForUser(this,propertyName);
      StoreResult<cmValue>(infoType,makefile,variable,value);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar1;
}

Assistant:

bool HandleSourceMode(cmExecutionStatus& status, const std::string& name,
                      OutType infoType, const std::string& variable,
                      const std::string& propertyName,
                      cmMakefile& directory_makefile,
                      const bool source_file_paths_should_be_absolute)
{
  if (name.empty()) {
    status.SetError("not given name for SOURCE scope.");
    return false;
  }

  // Get the source file.
  const std::string source_file_absolute_path =
    SetPropertyCommand::MakeSourceFilePathAbsoluteIfNeeded(
      status, name, source_file_paths_should_be_absolute);
  if (cmSourceFile* sf =
        directory_makefile.GetOrCreateSource(source_file_absolute_path)) {
    return StoreResult(infoType, status.GetMakefile(), variable,
                       sf->GetPropertyForUser(propertyName));
  }
  status.SetError(
    cmStrCat("given SOURCE name that could not be found or created: ",
             source_file_absolute_path));
  return false;
}